

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

int lj_cparse_case(GCstr *str,char *match)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    cVar1 = *match;
    uVar2 = (uint)cVar1;
    if (cVar1 == '\0') {
      return -1;
    }
    if ((str->len == uVar2) && (iVar3 = bcmp(match + 1,str + 1,(ulong)uVar2), iVar3 == 0)) break;
    iVar4 = iVar4 + 1;
    match = match + 1 + uVar2;
  }
  return iVar4;
}

Assistant:

int lj_cparse_case(GCstr *str, const char *match)
{
  MSize len;
  int n;
  for  (n = 0; (len = (MSize)*match++); n++, match += len) {
    if (str->len == len && !memcmp(match, strdata(str), len))
      return n;
  }
  return -1;
}